

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  pointer pnVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x0;
  uVar2 = (x->super_IdxSet).num;
  uVar3 = (y->super_IdxSet).num;
  if (0 < (long)(int)uVar3 && 0 < (long)(int)uVar2) {
    lVar11 = (long)(int)uVar2 + -1;
    lVar14 = (long)(int)uVar3 + -1;
    piVar12 = (x->super_IdxSet).idx;
    iVar5 = *piVar12;
    piVar7 = (y->super_IdxSet).idx;
    iVar8 = *piVar7;
    iVar15 = 0;
    iVar9 = 0;
    iVar10 = (int)lVar11;
    iVar13 = (int)lVar14;
    if (1 < uVar3 && 1 < uVar2) {
      iVar15 = 0;
      local_70 = x;
      do {
        if (iVar5 == iVar8) {
          lVar6 = (long)iVar8;
          pnVar4 = (x->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar16 = lVar6 * 0x38;
          local_a8.data._M_elems._32_8_ =
               *(undefined8 *)((long)&pnVar4[lVar6].m_backend.data + 0x20);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar6].m_backend.data;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[lVar6].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar4[lVar6].m_backend.data + 0x10);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_a8.exp = pnVar4[lVar6].m_backend.exp;
          local_a8.neg = pnVar4[lVar6].m_backend.neg;
          local_a8.fpclass = pnVar4[lVar6].m_backend.fpclass;
          local_a8.prec_elem = pnVar4[lVar6].m_backend.prec_elem;
          pnVar4 = (y->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_68.data._M_elems._32_8_ =
               *(undefined8 *)((long)&pnVar4[lVar6].m_backend.data + 0x20);
          local_68.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar6].m_backend.data;
          local_68.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[lVar6].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar4[lVar6].m_backend.data + 0x10);
          local_68.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_68.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_68.exp = pnVar4[lVar6].m_backend.exp;
          local_68.neg = pnVar4[lVar6].m_backend.neg;
          local_68.fpclass = pnVar4[lVar6].m_backend.fpclass;
          local_68.prec_elem = pnVar4[lVar6].m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_a8,&local_68);
          lVar6 = *(long *)(this + 0x20);
          *(undefined8 *)(lVar6 + lVar16) = local_a8.data._M_elems._0_8_;
          *(undefined8 *)((uint *)(lVar6 + lVar16) + 2) = local_a8.data._M_elems._8_8_;
          puVar1 = (uint *)(lVar6 + 0x10 + lVar16);
          *(undefined8 *)puVar1 = local_a8.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = local_a8.data._M_elems._24_8_;
          *(undefined8 *)(lVar6 + 0x20 + lVar16) = local_a8.data._M_elems._32_8_;
          *(int *)(lVar6 + 0x28 + lVar16) = local_a8.exp;
          *(bool *)(lVar6 + 0x2c + lVar16) = local_a8.neg;
          *(undefined8 *)(lVar6 + 0x30 + lVar16) = local_a8._48_8_;
          piVar12 = (local_70->super_IdxSet).idx;
          lVar6 = (long)iVar9;
          iVar9 = iVar9 + 1;
          iVar5 = piVar12[lVar6 + 1];
          piVar7 = (y->super_IdxSet).idx;
          x = local_70;
LAB_002f391e:
          lVar6 = (long)iVar15;
          iVar15 = iVar15 + 1;
          iVar8 = piVar7[lVar6 + 1];
        }
        else {
          if (iVar8 <= iVar5) goto LAB_002f391e;
          lVar6 = (long)iVar9;
          iVar9 = iVar9 + 1;
          iVar5 = piVar12[lVar6 + 1];
        }
      } while ((iVar9 < iVar10) && (iVar15 < iVar13));
    }
    if ((iVar9 < iVar10) && (iVar5 != iVar8)) {
      lVar6 = (long)iVar9;
      do {
        lVar6 = lVar6 + 1;
        iVar5 = piVar12[lVar6];
        if (lVar11 <= lVar6) break;
      } while (iVar5 != iVar8);
    }
    if ((iVar15 < iVar13) && (iVar5 != iVar8)) {
      lVar11 = (long)iVar15;
      do {
        lVar11 = lVar11 + 1;
        iVar8 = piVar7[lVar11];
        if (lVar14 <= lVar11) break;
      } while (iVar5 != iVar8);
    }
    if (iVar5 == iVar8) {
      lVar11 = (long)iVar5;
      pnVar4 = (x->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar11 * 0x38;
      local_a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 0x20);
      local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar11].m_backend.data;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x10);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_a8.exp = pnVar4[lVar11].m_backend.exp;
      local_a8.neg = pnVar4[lVar11].m_backend.neg;
      local_a8.fpclass = pnVar4[lVar11].m_backend.fpclass;
      local_a8.prec_elem = pnVar4[lVar11].m_backend.prec_elem;
      pnVar4 = (y->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 0x20);
      local_68.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar11].m_backend.data;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x10);
      local_68.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_68.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_68.exp = pnVar4[lVar11].m_backend.exp;
      local_68.neg = pnVar4[lVar11].m_backend.neg;
      local_68.fpclass = pnVar4[lVar11].m_backend.fpclass;
      local_68.prec_elem = pnVar4[lVar11].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_a8,&local_68);
      lVar11 = *(long *)(this + 0x20);
      *(undefined8 *)(lVar11 + lVar14) = local_a8.data._M_elems._0_8_;
      *(undefined8 *)((uint *)(lVar11 + lVar14) + 2) = local_a8.data._M_elems._8_8_;
      puVar1 = (uint *)(lVar11 + 0x10 + lVar14);
      *(undefined8 *)puVar1 = local_a8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_a8.data._M_elems._24_8_;
      *(undefined8 *)(lVar11 + 0x20 + lVar14) = local_a8.data._M_elems._32_8_;
      *(int *)(lVar11 + 0x28 + lVar14) = local_a8.exp;
      *(bool *)(lVar11 + 0x2c + lVar14) = local_a8.neg;
      *(undefined8 *)(lVar11 + 0x30 + lVar14) = local_a8._48_8_;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assignPWproduct4setup(const SSVectorBase<S>& x,
      const SSVectorBase<T>& y)
{
   assert(dim() == x.dim());
   assert(x.dim() == y.dim());
   assert(x.isSetup());
   assert(y.isSetup());

   clear();
   setupStatus = false;

   int i = 0;
   int j = 0;
   int n = x.size() - 1;
   int m = y.size() - 1;

   /* both x and y non-zero vectors? */
   if(m >= 0 && n >= 0)
   {
      int xi = x.index(i);
      int yj = y.index(j);

      while(i < n && j < m)
      {
         if(xi == yj)
         {
            VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
            xi = x.index(++i);
            yj = y.index(++j);
         }
         else if(xi < yj)
            xi = x.index(++i);
         else
            yj = y.index(++j);
      }

      /* check (possible) remaining indices */

      while(i < n && xi != yj)
         xi = x.index(++i);

      while(j < m && xi != yj)
         yj = y.index(++j);

      if(xi == yj)
         VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
   }

   setup();

   assert(isConsistent());

   return *this;
}